

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

void __thiscall QTabBarPrivate::scrollTabs(QTabBarPrivate *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  QToolButton *pQVar4;
  qsizetype qVar5;
  long lVar6;
  const_reference ppTVar7;
  QTabBarPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar8;
  int end;
  int start_1;
  int start;
  int i;
  bool horizontal;
  QObject *sender;
  QTabBar *q;
  QRect tabRect;
  QRect scrollRect;
  qsizetype in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int local_88;
  int local_84;
  int local_74;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar9;
  undefined4 in_stack_ffffffffffffffac;
  uint uVar10;
  undefined8 in_stack_ffffffffffffffd0;
  QTabBarPrivate *this_00;
  
  this_00 = *(QTabBarPrivate **)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  pQVar4 = (QToolButton *)QObject::sender();
  bVar2 = verticalTabs(in_RDI->shape);
  uVar10 = (CONCAT13(bVar2,(int3)in_stack_ffffffffffffffac) ^ 0xff000000) & 0x1ffffff;
  QVar8 = normalizedScrollRect(this_00,-0x55555556);
  QRect::translated((QRect *)CONCAT44(uVar10,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa4,
                    in_stack_ffffffffffffffa0);
  if (pQVar4 == in_RDI->leftB) {
    qVar5 = QList<QTabBarPrivate::Tab_*>::size(&in_RDI->tabList);
    iVar9 = (int)qVar5;
    do {
      iVar9 = iVar9 + -1;
      if (iVar9 < 0) goto LAB_006a9857;
      if ((uVar10 & 0x1000000) == 0) {
        QList<QTabBarPrivate::Tab_*>::at
                  ((QList<QTabBarPrivate::Tab_*> *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68);
        local_74 = QRect::top((QRect *)0x6a96c4);
      }
      else {
        QList<QTabBarPrivate::Tab_*>::at
                  ((QList<QTabBarPrivate::Tab_*> *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68);
        local_74 = QRect::left((QRect *)0x6a969c);
      }
      iVar1 = QRect::left((QRect *)0x6a96e5);
    } while (iVar1 <= local_74);
    makeVisible(QVar8._0_8_,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  }
  else if (pQVar4 == in_RDI->rightB) {
    for (iVar9 = 0; lVar6 = (long)iVar9,
        qVar5 = QList<QTabBarPrivate::Tab_*>::size(&in_RDI->tabList), lVar6 < qVar5;
        iVar9 = iVar9 + 1) {
      ppTVar7 = QList<QTabBarPrivate::Tab_*>::at
                          ((QList<QTabBarPrivate::Tab_*> *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           in_stack_ffffffffffffff68);
      iVar1 = ((*ppTVar7)->rect).y2.m_i;
      if ((uVar10 & 0x1000000) == 0) {
        local_84 = QRect::top((QRect *)0x6a97c8);
      }
      else {
        local_84 = QRect::left((QRect *)0x6a97b8);
      }
      if ((uVar10 & 0x1000000) == 0) {
        local_88 = QRect::bottom((QRect *)0x6a97f5);
      }
      else {
        local_88 = QRect::right((QRect *)0x6a97e5);
      }
      iVar3 = QRect::right((QRect *)0x6a9816);
      if ((iVar3 < local_88) && (in_RDI->scrollOffset < local_84)) {
        makeVisible(QVar8._0_8_,iVar1);
        break;
      }
      in_stack_ffffffffffffff74 = local_88;
    }
  }
LAB_006a9857:
  if (*(QTabBarPrivate **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTabBarPrivate::scrollTabs()
{
    Q_Q(QTabBar);
    const QObject *sender = q->sender();
    const bool horizontal = !verticalTabs(shape);
    const QRect scrollRect = normalizedScrollRect().translated(scrollOffset, 0);

    int i = -1;

    if (sender == leftB) {
        for (i = tabList.size() - 1; i >= 0; --i) {
            int start = horizontal ? tabList.at(i)->rect.left() : tabList.at(i)->rect.top();
            if (start < scrollRect.left()) {
                makeVisible(i);
                return;
            }
        }
    } else if (sender == rightB) {
        for (i = 0; i < tabList.size(); ++i) {
            const auto tabRect = tabList.at(i)->rect;
            int start = horizontal ? tabRect.left() : tabRect.top();
            int end = horizontal ? tabRect.right() : tabRect.bottom();
            if (end > scrollRect.right() && start > scrollOffset) {
                makeVisible(i);
                return;
            }
        }
    }
}